

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O0

void ParseActor(FScanner *sc)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  CRecoverableError *err;
  undefined1 local_98 [8];
  Baggage bag;
  PClassActor *info;
  FScanner *sc_local;
  
  bag.ScriptPosition.ScriptLine = 0;
  bag.ScriptPosition._12_4_ = 0;
  Baggage::Baggage((Baggage *)local_98);
  bag.Info._2_1_ = 1;
  bag.ScriptPosition._8_8_ = ParseActorHeader(sc,(Baggage *)local_98);
  FScanner::MustGetToken(sc,0x7b);
  while (FScanner::MustGetAnyToken(sc), sc->TokenType != 0x7d) {
    iVar1 = sc->TokenType;
    if ((iVar1 == 0x2b) || (iVar1 == 0x2d)) {
      ParseActorFlag(sc,(Baggage *)local_98,sc->TokenType);
    }
    else if (iVar1 == 0x101) {
      ParseActorProperty(sc,(Baggage *)local_98);
    }
    else if (iVar1 == 0x128) {
      ParseConstant(sc,(PSymbolTable *)(bag.ScriptPosition._8_8_ + 0x38),
                    (PClassActor *)bag.ScriptPosition._8_8_);
    }
    else if (iVar1 == 0x147) {
      ParseEnum(sc,(PSymbolTable *)(bag.ScriptPosition._8_8_ + 0x38),
                (PClassActor *)bag.ScriptPosition._8_8_);
    }
    else if (iVar1 == 0x159) {
      ParseUserVariable(sc,(PSymbolTable *)(bag.ScriptPosition._8_8_ + 0x38),
                        (PClassActor *)bag.ScriptPosition._8_8_);
    }
    else if (iVar1 == 0x181) {
      ParseStates(sc,(PClassActor *)bag.ClassName.Chars,*(AActor **)(bag.ClassName.Chars + 0xe8),
                  (Baggage *)local_98);
      bag.Info._1_1_ = 1;
    }
    else {
      pcVar2 = sc->String;
      pcVar3 = FName::GetChars((FName *)(bag.ClassName.Chars + 0xa0));
      FScanner::ScriptError(sc,"Unexpected \'%s\' in definition of \'%s\'",pcVar2,pcVar3);
    }
  }
  if (((byte)bag.Info & 1) != 0) {
    PClassActor::SetDropItems
              ((PClassActor *)bag.ClassName.Chars,(DDropItem *)bag.statedef.SourceLines._8_8_);
  }
  (**(code **)(*(long *)bag.ScriptPosition._8_8_ + 0xc0))();
  FScanner::SetCMode(sc,false);
  Baggage::~Baggage((Baggage *)local_98);
  return;
}

Assistant:

static void ParseActor(FScanner &sc)
{
	PClassActor *info = NULL;
	Baggage bag;

	bag.fromDecorate = true;
	info = ParseActorHeader(sc, &bag);
	sc.MustGetToken('{');
	while (sc.MustGetAnyToken(), sc.TokenType != '}')
	{
		switch (sc.TokenType)
		{
		case TK_Const:
			ParseConstant (sc, &info->Symbols, info);
			break;

		case TK_Enum:
			ParseEnum (sc, &info->Symbols, info);
			break;

		case TK_Var:
			ParseUserVariable (sc, &info->Symbols, info);
			break;

		case TK_Identifier:
			ParseActorProperty(sc, bag);
			break;

		case TK_States:
			ParseStates(sc, bag.Info, (AActor *)bag.Info->Defaults, bag);
			bag.StateSet = true;
			break;

		case '+':
		case '-':
			ParseActorFlag(sc, bag, sc.TokenType);
			break;

		default:
			sc.ScriptError("Unexpected '%s' in definition of '%s'", sc.String, bag.Info->TypeName.GetChars());
			break;
		}
	}
	if (bag.DropItemSet)
	{
		bag.Info->SetDropItems(bag.DropItemList);
	}
	try
	{
		info->Finalize(bag.statedef);
	}
	catch (CRecoverableError &err)
	{
		sc.ScriptError("%s", err.GetMessage());
	}
	sc.SetCMode (false);
}